

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::FieldMap(FieldMap *this,FieldMap *rhs)

{
  FieldMap *rhs_local;
  FieldMap *this_local;
  
  this->_vptr_FieldMap = (_func_int **)&PTR__FieldMap_0032f968;
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::vector
            (&this->m_fields,&rhs->m_fields);
  std::
  map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
  ::map(&this->m_groups,&rhs->m_groups);
  message_order::message_order(&this->m_order,&rhs->m_order);
  return;
}

Assistant:

FieldMap::FieldMap(FieldMap &&rhs)
    : m_fields(std::move(rhs.m_fields)),
      m_groups(std::move(rhs.m_groups)),
      m_order(std::move(rhs.m_order)) {}